

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
UnorderedElementsAreMatcher<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>_>
::~UnorderedElementsAreMatcher
          (UnorderedElementsAreMatcher<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->matchers_).
           super__Tuple_impl<0UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
           .super__Head_base<0UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_false>.
           _M_head_impl.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->matchers_).
           super__Tuple_impl<0UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
           .
           super__Tuple_impl<1UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
           .super__Head_base<1UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_false>.
           _M_head_impl.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->matchers_).
                   super__Tuple_impl<0UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>
                   .super__Tuple_impl<2UL,_std::shared_ptr<const_bssl::ParsedCertificate>_>.
                   super__Head_base<2UL,_std::shared_ptr<const_bssl::ParsedCertificate>,_false>.
                   _M_head_impl.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> + 8
           ))->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

explicit UnorderedElementsAreMatcher(const MatcherTuple& args)
      : matchers_(args) {}